

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

pair<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_bool> __thiscall
eastl::
vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>::
insert(vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>
       *this,value_type *val)

{
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar1;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *position;
  pair<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_bool> pVar7;
  
  ppVar1 = (this->m_base).
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           .mpBegin;
  ppVar2 = (this->m_base).
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           .mpEnd;
  position = ppVar1;
  if (0 < (long)ppVar2 - (long)ppVar1) {
    uVar6 = ((ulong)((long)ppVar2 - (long)ppVar1) >> 3) * -0x3333333333333333;
    do {
      uVar4 = uVar6 >> 1;
      uVar5 = uVar4;
      if (position[uVar4].first < val->first) {
        uVar5 = ~uVar4 + uVar6;
        position = position + uVar4 + 1;
      }
      uVar6 = uVar5;
    } while (0 < (long)uVar5);
  }
  if ((position == ppVar2) || (val->first < position->first)) {
    if ((position == ppVar2) &&
       (ppVar2 != (this->m_base).
                  super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                  .mpCapacity)) {
      (this->m_base).
      super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
      .mpEnd = ppVar2 + 1;
      ppVar2->first = val->first;
      (ppVar2->second).mpBegin = (value_type *)0x0;
      (ppVar2->second).mpEnd = (value_type *)0x0;
      (ppVar2->second).mpCapacity = (value_type *)0x0;
      basic_string<char,_eastl::allocator>::RangeInitialize
                (&ppVar2->second,(val->second).mpBegin,(val->second).mpEnd);
      uVar3 = extraout_RDX;
    }
    else {
      vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>::
      DoInsertValue(&this->m_base,position,val);
      uVar3 = extraout_RDX_00;
    }
    position = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)
               ((long)position +
               ((long)(this->m_base).
                      super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                      .mpBegin - (long)ppVar1));
    uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
  }
  else {
    uVar3 = 0;
  }
  pVar7._8_8_ = uVar3;
  pVar7.first = position;
  return pVar7;
}

Assistant:

::eastl::pair<iterator, bool> insert(value_type const& val) {
    iterator const i(lower_bound(val.first));

    return (i == end() || m_cmp(val.first, i->first))
        ? ::eastl::make_pair(m_base.insert(i, val), true)
        : ::eastl::make_pair(i, false)
        ;
  }